

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

void timestamp(void)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  long lVar3;
  
  if (timestamp()::prev == '\0') {
    iVar1 = __cxa_guard_acquire(&timestamp()::prev);
    if (iVar1 != 0) {
      timestamp::prev.__r = std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&timestamp()::prev);
    }
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar2 - timestamp::prev.__r;
  timestamp::prev.__r = lVar2;
  printf("%lli: ",lVar3 / 1000000,lVar3 % 1000000,in_RAX);
  return;
}

Assistant:

inline void timestamp() {
  static auto prev = std::chrono::system_clock::now().time_since_epoch();

  auto time = std::chrono::system_clock::now().time_since_epoch();
  auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(time - prev);
  prev = time;

  printf("%lli: ", milliseconds.count());
}